

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intDup.c
# Opt level: O1

Aig_Man_t * Inter_ManStartDuplicated(Aig_Man_t *p)

{
  char *pcVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  ulong uVar9;
  Aig_Obj_t *p1;
  int iVar10;
  long lVar11;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intDup.c"
                  ,0x4e,"Aig_Man_t *Inter_ManStartDuplicated(Aig_Man_t *)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar11];
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
      lVar11 = lVar11 + 1;
      pVVar7 = p->vCis;
    } while (lVar11 < pVVar7->nSize);
  }
  p_00->nTruePis = p->nTruePis;
  p_00->nTruePos = p->nConstrs;
  p_00->nRegs = p->nRegs;
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar11];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_0063c464;
        uVar8 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        uVar8 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar6 = Aig_And(p_00,pAVar6,p1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
      }
      lVar11 = lVar11 + 1;
      pVVar7 = p->vObjs;
    } while (lVar11 < pVVar7->nSize);
  }
  uVar8 = (ulong)(uint)p->nTruePos;
  if (0 < p->nTruePos) {
    lVar11 = 0;
    do {
      if (p->vCos->nSize <= lVar11) goto LAB_0063c445;
      if ((long)(int)uVar8 - (long)p->nConstrs <= lVar11) {
        pvVar2 = p->vCos->pArray[lVar11];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_0063c464;
        uVar8 = *(ulong *)((long)pvVar2 + 8);
        uVar9 = uVar8 & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar6 = (Aig_Obj_t *)0x1;
        }
        else {
          pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar9 + 0x28) ^ 1);
        }
        Aig_ObjCreateCo(p_00,pAVar6);
      }
      lVar11 = lVar11 + 1;
      uVar8 = (ulong)p->nTruePos;
    } while (lVar11 < (long)uVar8);
  }
  if (0 < p->nRegs) {
    iVar10 = 0;
    do {
      uVar3 = p->nTruePos + iVar10;
      if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
LAB_0063c445:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vCos->pArray[uVar3];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_0063c464:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar8 = *(ulong *)((long)pvVar2 + 8);
      uVar9 = uVar8 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      Aig_ObjCreateCo(p_00,pAVar6);
      iVar10 = iVar10 + 1;
    } while (iVar10 < p->nRegs);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Inter_ManStartDuplicated( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = Saig_ManConstrNum(p);
    pNew->nRegs    = p->nRegs;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // create constraint outputs
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            continue;
        Aig_ObjCreateCo( pNew, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
    }

    // create register inputs with MUXes
    Saig_ManForEachLi( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    return pNew;
}